

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

void __thiscall
lf::io::VtkWriter::WriteScalarCellData<float>
          (VtkWriter *this,string *name,MeshDataSet<float> *mds,float undefined_value)

{
  Attributes *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  float *pfVar8;
  long extraout_RDX;
  long lVar9;
  float fVar10;
  ScalarData<float> data;
  ScalarData<float> local_e8;
  variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
  local_90;
  
  this_00 = &(this->vtk_file_).cell_data;
  CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
            (this,this_00,name);
  local_e8.lookup_table._M_string_length = 0;
  local_e8.lookup_table.field_2._M_allocated_capacity = 0;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.lookup_table._M_dataplus._M_p = (pointer)0x0;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.name.field_2._M_allocated_capacity = 0;
  local_e8.name.field_2._8_8_ = 0;
  local_e8.name._M_dataplus._M_p = (pointer)0x0;
  local_e8.name._M_string_length = 0;
  local_e8.lookup_table.field_2._8_8_ = 0;
  VtkFile::ScalarData<float>::ScalarData(&local_e8);
  peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  uVar6 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)this->codim_);
  std::vector<float,_std::allocator<float>_>::resize(&local_e8.data,(ulong)uVar6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_e8.name,name);
  peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  iVar7 = (*peVar3->_vptr_Mesh[2])(peVar3,(ulong)this->codim_);
  if (extraout_RDX != 0) {
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(CONCAT44(extraout_var,iVar7) + lVar9);
      cVar5 = (**(code **)(*(long *)mds + 8))(mds,uVar4);
      if (cVar5 == '\0') {
        peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar6 = (*peVar3->_vptr_Mesh[5])(peVar3,uVar4);
        fVar10 = undefined_value;
      }
      else {
        pfVar8 = (float *)(*(code *)**(undefined8 **)mds)(mds,uVar4);
        fVar10 = *pfVar8;
        peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar6 = (*peVar3->_vptr_Mesh[5])(peVar3,uVar4);
      }
      local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = fVar10;
      lVar9 = lVar9 + 8;
    } while (extraout_RDX << 3 != lVar9);
  }
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_.align_ =
       (type)((long)&local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_ + 0x10);
  paVar1 = &local_e8.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p == paVar1) {
    local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._24_8_ =
         local_e8.name.field_2._8_8_;
  }
  else {
    local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_.align_ =
         (type)local_e8.name._M_dataplus._M_p;
  }
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._16_8_ =
       local_e8.name.field_2._M_allocated_capacity;
  paVar2 = &local_e8.lookup_table.field_2;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._56_8_ =
       (long)&local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_ + 0x48;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._8_8_ =
       local_e8.name._M_string_length;
  local_e8.name._M_string_length = 0;
  local_e8.name.field_2._M_allocated_capacity =
       local_e8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._32_8_ =
       local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._40_8_ =
       local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._48_8_ =
       local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.lookup_table._M_dataplus._M_p == paVar2) {
    local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._80_8_ =
         local_e8.lookup_table.field_2._8_8_;
  }
  else {
    local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._56_8_ =
         local_e8.lookup_table._M_dataplus._M_p;
  }
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._72_8_ =
       local_e8.lookup_table.field_2._M_allocated_capacity;
  local_90.storage_.super_aligned_storage_imp<88UL,_8UL>.data_._64_8_ =
       local_e8.lookup_table._M_string_length;
  local_e8.lookup_table._M_string_length = 0;
  local_e8.lookup_table.field_2._M_allocated_capacity =
       local_e8.lookup_table.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_90.which_ = 8;
  local_e8.name._M_dataplus._M_p = (pointer)paVar1;
  local_e8.lookup_table._M_dataplus._M_p = (pointer)paVar2;
  std::
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
  ::
  emplace_back<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>
            ((vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
              *)this_00,&local_90);
  boost::
  variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
  ::destroy_content(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.lookup_table._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.lookup_table._M_dataplus._M_p,
                    local_e8.lookup_table.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VtkWriter::WriteScalarCellData(const std::string& name,
                                    const mesh::utils::MeshDataSet<T>& mds,
                                    T undefined_value) {
  CheckAttributeSetName(vtk_file_.cell_data, name);
  VtkFile::ScalarData<T> data{};
  data.data.resize(mesh_->NumEntities(codim_));
  data.name = name;
  for (const auto* e : mesh_->Entities(codim_)) {
    if (mds.DefinedOn(*e)) {
      data.data[mesh_->Index(*e)] = mds(*e);
    } else {
      data.data[mesh_->Index(*e)] = undefined_value;
    }
  }
  vtk_file_.cell_data.push_back(std::move(data));
}